

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O1

void ps_mask_table_done(PS_Mask_Table table,FT_Memory memory)

{
  FT_UInt FVar1;
  FT_Byte **ppFVar2;
  
  FVar1 = table->max_masks;
  if (FVar1 != 0) {
    ppFVar2 = &table->masks->bytes;
    do {
      ft_mem_free(memory,*ppFVar2);
      ((PS_MaskRec_ *)(ppFVar2 + -1))->num_bits = 0;
      ((PS_MaskRec_ *)(ppFVar2 + -1))->max_bits = 0;
      *ppFVar2 = (FT_Byte *)0x0;
      *(FT_UInt *)(ppFVar2 + 1) = 0;
      ppFVar2 = ppFVar2 + 3;
      FVar1 = FVar1 - 1;
    } while (FVar1 != 0);
  }
  ft_mem_free(memory,table->masks);
  table->num_masks = 0;
  table->max_masks = 0;
  table->masks = (PS_Mask)0x0;
  return;
}

Assistant:

static void
  ps_mask_table_done( PS_Mask_Table  table,
                      FT_Memory      memory )
  {
    FT_UInt  count = table->max_masks;
    PS_Mask  mask  = table->masks;


    for ( ; count > 0; count--, mask++ )
      ps_mask_done( mask, memory );

    FT_FREE( table->masks );
    table->num_masks = 0;
    table->max_masks = 0;
  }